

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O2

mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
* __thiscall
ising::free_energy::square::
infinite<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
          (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
           *__return_storage_ptr__,square *this,
          mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
          *Jx,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
              *Jy,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                  *beta)

{
  type_conflict6 tVar1;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *pmVar2;
  invalid_argument *this_00;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffffa68;
  uint uVar3;
  uint in_stack_fffffffffffffa74;
  size_t *in_stack_fffffffffffffa78;
  tanh_sinh<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  integrator;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_548;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_508;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_4c8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_490;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_458;
  type local_420;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_3e8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_3b0;
  type local_378;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_340;
  functor<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  local_308;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_260;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_228;
  cpp_dec_float<50U,_int,_void> local_1f0;
  fvar_t local_1b8;
  type local_180;
  cpp_dec_float<50U,_int,_void> local_148;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_110;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_d8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  logZ;
  type local_68;
  
  tVar1 = boost::multiprecision::operator<=
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                      *)this,(int *)&stack0xfffffffffffffa70);
  if (!tVar1) {
    local_490.base.m_backend.data._M_elems[0] = 0;
    tVar1 = boost::multiprecision::operator<=(&Jx->base,(int *)&local_490);
    if (!tVar1) {
      uVar3 = 0;
      tVar1 = boost::multiprecision::operator<=(&Jy->base,(int *)&stack0xfffffffffffffa70);
      if (!tVar1) {
        pmVar2 = boost::math::constants::detail::
                 constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ::get_from_string();
        local_458.base.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(pmVar2->base).m_backend.data._M_elems;
        local_458.base.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((pmVar2->base).m_backend.data._M_elems + 2);
        local_458.base.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((pmVar2->base).m_backend.data._M_elems + 4);
        local_458.base.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((pmVar2->base).m_backend.data._M_elems + 6);
        local_458.base.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((pmVar2->base).m_backend.data._M_elems + 8);
        local_458.base.m_backend.exp = (pmVar2->base).m_backend.exp;
        local_458.base.m_backend.neg = (pmVar2->base).m_backend.neg;
        local_458.base.m_backend.fpclass = (pmVar2->base).m_backend.fpclass;
        local_458.base.m_backend.prec_elem = (pmVar2->base).m_backend.prec_elem;
        std::
        numeric_limits<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
        ::min();
        ::operator*((type *)&stack0xfffffffffffffa70,&local_490,4);
        boost::math::quadrature::
        tanh_sinh<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
        ::tanh_sinh(&integrator,0xf,(type *)&stack0xfffffffffffffa70);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_148,2,(type *)0x0);
        log<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>
                  (&local_110,
                   (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)&local_148);
        operator/(&local_d8,&local_110,2);
        local_4c8.base.m_backend.data._M_elems._32_8_ = *(undefined8 *)(this + 0x20);
        local_4c8.base.m_backend.data._M_elems._0_8_ = *(undefined8 *)this;
        local_4c8.base.m_backend.data._M_elems._8_8_ = *(undefined8 *)(this + 8);
        local_4c8.base.m_backend.data._M_elems._16_8_ = *(undefined8 *)(this + 0x10);
        local_4c8.base.m_backend.data._M_elems._24_8_ = *(undefined8 *)(this + 0x18);
        local_4c8.base.m_backend.exp = *(int *)(this + 0x28);
        local_4c8.base.m_backend.neg = *(bool *)(this + 0x2c);
        local_4c8.base.m_backend._48_8_ = *(undefined8 *)(this + 0x30);
        local_508.base.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((Jx->base).m_backend.data._M_elems + 8);
        local_508.base.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(Jx->base).m_backend.data._M_elems;
        local_508.base.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((Jx->base).m_backend.data._M_elems + 2);
        local_508.base.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((Jx->base).m_backend.data._M_elems + 4);
        local_508.base.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((Jx->base).m_backend.data._M_elems + 6);
        local_508.base.m_backend.exp = (Jx->base).m_backend.exp;
        local_508.base.m_backend.neg = (Jx->base).m_backend.neg;
        local_508.base.m_backend.fpclass = (Jx->base).m_backend.fpclass;
        local_508.base.m_backend.prec_elem = (Jx->base).m_backend.prec_elem;
        local_548.base.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((Jy->base).m_backend.data._M_elems + 8);
        local_548.base.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(Jy->base).m_backend.data._M_elems;
        local_548.base.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((Jy->base).m_backend.data._M_elems + 2);
        local_548.base.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((Jy->base).m_backend.data._M_elems + 4);
        local_548.base.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((Jy->base).m_backend.data._M_elems + 6);
        local_548.base.m_backend.exp = (Jy->base).m_backend.exp;
        local_548.base.m_backend.neg = (Jy->base).m_backend.neg;
        local_548.base.m_backend.fpclass = (Jy->base).m_backend.fpclass;
        local_548.base.m_backend.prec_elem = (Jy->base).m_backend.prec_elem;
        pmVar2 = boost::math::constants::detail::
                 constant_pi<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ::get_from_string();
        ::operator*(&local_490,2,pmVar2);
        operator/((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&stack0xfffffffffffffa70,1,&local_490);
        local_308.c_.base.m_backend.data._M_elems[1] = in_stack_fffffffffffffa74;
        local_308.c_.base.m_backend.data._M_elems[0] = uVar3;
        ::operator*(&local_378,2,&local_548);
        ::operator*(&local_340,&local_378,&local_4c8);
        cosh<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>
                  (&local_490,&local_340);
        ::operator*(&local_420,2,&local_548);
        ::operator*(&local_3e8,&local_420,&local_508);
        cosh<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>
                  (&local_3b0,&local_3e8);
        ::operator*((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                     *)&stack0xfffffffffffffa70,&local_490,&local_3b0);
        local_308.chab_.base.m_backend.data._M_elems[1] = in_stack_fffffffffffffa74;
        local_308.chab_.base.m_backend.data._M_elems[0] = uVar3;
        ::operator*(&local_3b0,2,&local_548);
        ::operator*(&local_378,&local_3b0,&local_4c8);
        sinh<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>
                  (&local_340,&local_378);
        ::operator*(&local_68,2,&local_548);
        ::operator*(&local_420,&local_68,&local_508);
        sinh<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>
                  (&local_3e8,&local_420);
        ::operator*(&local_490,&local_340,&local_3e8);
        operator/((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&stack0xfffffffffffffa70,1,&local_490);
        local_308.k_.base.m_backend.data._M_elems[1] = in_stack_fffffffffffffa74;
        local_308.k_.base.m_backend.data._M_elems[0] = uVar3;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_1f0,0,(type *)0x0);
        operator/(&local_228,&local_458,2);
        boost::math::tools::
        root_epsilon<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                  ();
        boost::math::quadrature::
        tanh_sinh<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
        ::
        integrate<ising::free_energy::square::(anonymous_namespace)::functor<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
                  (&local_1b8,&integrator,&local_308,
                   (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)&local_1f0,&local_228,&local_260,in_stack_fffffffffffffa68,
                   (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)CONCAT44(in_stack_fffffffffffffa74,uVar3),in_stack_fffffffffffffa78);
        ::operator*(&local_180,2,&local_1b8);
        operator+(&logZ,&local_d8,&local_180);
        operator-((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&stack0xfffffffffffffa70,&logZ);
        operator/(__return_storage_ptr__,
                  (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&stack0xfffffffffffffa70,Jy);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&integrator.m_imp.
                    super___shared_ptr<boost::math::quadrature::detail::tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        return __return_storage_ptr__;
      }
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"beta should be positive");
      goto LAB_0012454d;
    }
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Jx and Jy should be positive");
LAB_0012454d:
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline U infinite(T Jx, T Jy, U beta) {
  const unsigned long max_n = 1 << 16;
  typedef T real_t;
  if (Jx <= 0 || Jy <= 0)
    throw(std::invalid_argument("Jx and Jy should be positive"));
  if (beta <= 0)
    throw(std::invalid_argument("beta should be positive"));
  real_t pi = boost::math::constants::pi<real_t>();
  boost::math::quadrature::tanh_sinh<real_t> integrator;
  auto logZ = log(real_t(2)) / 2 +
              2 * integrator.integrate(func(Jx, Jy, beta), 0, pi / 2);
  return -logZ / beta;
}